

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O0

void __thiscall
PathTracer::Reset(PathTracer *this,shared_ptr<myvk::CommandPool> *command_pool,
                 shared_ptr<myvk::Queue> *shared_queue)

{
  initializer_list<std::shared_ptr<myvk::Queue>_> __l;
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  Ptr<ImageView> *in_RDI;
  float fVar4;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_00000010;
  shared_ptr<myvk::Device> *in_stack_00000018;
  PathTracer *in_stack_00000020;
  float tmp;
  shared_ptr<myvk::CommandPool> *in_stack_000002d8;
  PathTracer *in_stack_000002e0;
  shared_ptr<myvk::Queue> *in_stack_fffffffffffffef8;
  shared_ptr<myvk::Queue> *in_stack_ffffffffffffff00;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_ffffffffffffff10;
  allocator_type *in_stack_ffffffffffffff28;
  undefined1 ****ppppuVar5;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_ffffffffffffff30;
  undefined1 ****ppppuVar6;
  iterator in_stack_ffffffffffffff38;
  undefined8 ***pppuVar7;
  undefined8 in_stack_ffffffffffffff48;
  uint32_t current_frame;
  undefined4 in_stack_ffffffffffffff50;
  uint32_t in_stack_ffffffffffffff60;
  allocator<std::shared_ptr<myvk::Queue>_> local_7d [13];
  undefined1 ***local_70;
  undefined8 **local_68;
  uint32_t in_stack_ffffffffffffffa4;
  shared_ptr<myvk::CommandPool> *in_stack_ffffffffffffffa8;
  Sobol *in_stack_ffffffffffffffb0;
  undefined1 ***local_48;
  undefined8 local_40;
  float local_1c;
  DescriptorSet *this_00;
  
  current_frame = (uint32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  peVar2 = std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x170a3a);
  local_1c = peVar2->m_aspect_ratio;
  fVar4 = (float)*(uint *)&in_RDI[0x1a].
                           super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi /
          (float)*(uint *)((long)&in_RDI[0x1a].
                                  super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi + 4);
  peVar2 = std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x170a7a);
  peVar2->m_aspect_ratio = fVar4;
  std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x170a8f);
  Camera::UpdateFrameUniformBuffer
            ((Camera *)CONCAT44(fVar4,in_stack_ffffffffffffff50),current_frame);
  fVar4 = local_1c;
  peVar2 = std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x170ab5);
  peVar2->m_aspect_ratio = fVar4;
  Sobol::Reset(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
  peVar3 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x170af5);
  iVar1 = (*(peVar3->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  this_00 = (DescriptorSet *)CONCAT44(extraout_var,iVar1);
  local_70 = (undefined1 ***)&local_68;
  peVar3 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x170b23);
  myvk::CommandPool::GetQueuePtr(peVar3);
  pppuVar7 = &local_68;
  std::shared_ptr<myvk::Queue>::shared_ptr(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_70 = (undefined1 ***)&stack0xffffffffffffffa8;
  std::shared_ptr<myvk::Queue>::shared_ptr(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_40 = 2;
  local_48 = (undefined1 ***)pppuVar7;
  std::allocator<std::shared_ptr<myvk::Queue>_>::allocator
            ((allocator<std::shared_ptr<myvk::Queue>_> *)0x170b97);
  __l._M_len = (size_type)pppuVar7;
  __l._M_array = in_stack_ffffffffffffff38;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            (in_stack_ffffffffffffff30,__l,in_stack_ffffffffffffff28);
  create_target_images(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (in_stack_ffffffffffffff10);
  std::allocator<std::shared_ptr<myvk::Queue>_>::~allocator(local_7d);
  ppppuVar6 = (undefined1 ****)&local_68;
  ppppuVar5 = &local_48;
  do {
    ppppuVar5 = ppppuVar5 + -2;
    std::shared_ptr<myvk::Queue>::~shared_ptr((shared_ptr<myvk::Queue> *)0x170c17);
  } while (ppppuVar5 != ppppuVar6);
  clear_target_images(in_stack_000002e0,in_stack_000002d8);
  std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x170c4e);
  myvk::DescriptorSet::UpdateStorageImage(this_00,in_RDI,(uint32_t)fVar4,in_stack_ffffffffffffff60);
  std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x170c77);
  myvk::DescriptorSet::UpdateStorageImage(this_00,in_RDI,(uint32_t)fVar4,in_stack_ffffffffffffff60);
  std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x170ca3);
  myvk::DescriptorSet::UpdateStorageImage(this_00,in_RDI,(uint32_t)fVar4,in_stack_ffffffffffffff60);
  return;
}

Assistant:

void PathTracer::Reset(const std::shared_ptr<myvk::CommandPool> &command_pool,
                       const std::shared_ptr<myvk::Queue> &shared_queue) {
	{
		float tmp = m_camera_ptr->m_aspect_ratio;
		m_camera_ptr->m_aspect_ratio = m_width / float(m_height);
		m_camera_ptr->UpdateFrameUniformBuffer(kFrameCount);
		m_camera_ptr->m_aspect_ratio = tmp;
	}
	m_sobol.Reset(command_pool, (m_bounce + 1) * 2);
	create_target_images(command_pool->GetDevicePtr(), {command_pool->GetQueuePtr(), shared_queue});
	clear_target_images(command_pool);
	m_target_descriptor_set->UpdateStorageImage(m_color_image_view, 0);
	m_target_descriptor_set->UpdateStorageImage(m_albedo_image_view, 1);
	m_target_descriptor_set->UpdateStorageImage(m_normal_image_view, 2);
}